

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URITest.cpp
# Opt level: O2

void __thiscall jaegertracing::net::URI_queryUnescape_Test::TestBody(URI_queryUnescape_Test *this)

{
  char *pcVar1;
  allocator local_59;
  AssertionResult gtest_ar;
  string local_48 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::__cxx11::string::string(local_48,"hello%20world",&local_59);
  jaegertracing::net::URI::queryUnescape((string *)&local_28);
  testing::internal::CmpHelperEQ<char[12],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"hello world\"","URI::queryUnescape(\"hello%20world\")",
             (char (*) [12])"hello world",&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
               ,0x41,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_48,(Message *)&local_28);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    std::__cxx11::string::string(local_48,"hello%2world",&local_59);
    jaegertracing::net::URI::queryUnescape((string *)&local_28);
    testing::internal::CmpHelperEQ<char[13],std::__cxx11::string>
              ((internal *)&gtest_ar,"\"hello%2world\"","URI::queryUnescape(\"hello%2world\")",
               (char (*) [13])"hello%2world",&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::~string(local_48);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_28);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                 ,0x42,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_48,(Message *)&local_28);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      std::__cxx11::string::string(local_48,"hello%world",&local_59);
      jaegertracing::net::URI::queryUnescape((string *)&local_28);
      testing::internal::CmpHelperEQ<char[12],std::__cxx11::string>
                ((internal *)&gtest_ar,"\"hello%world\"","URI::queryUnescape(\"hello%world\")",
                 (char (*) [12])"hello%world",&local_28);
      std::__cxx11::string::~string((string *)&local_28);
      std::__cxx11::string::~string(local_48);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_28);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                   ,0x43,pcVar1);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_48,(Message *)&local_28);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        std::__cxx11::string::string(local_48,"hello w%6Frld",&local_59);
        jaegertracing::net::URI::queryUnescape((string *)&local_28);
        testing::internal::CmpHelperEQ<char[12],std::__cxx11::string>
                  ((internal *)&gtest_ar,"\"hello world\"","URI::queryUnescape(\"hello w%6Frld\")",
                   (char (*) [12])"hello world",&local_28);
        std::__cxx11::string::~string((string *)&local_28);
        std::__cxx11::string::~string(local_48);
        if (gtest_ar.success_ != false) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          std::__cxx11::string::string(local_48,"hello w%6frld",&local_59);
          jaegertracing::net::URI::queryUnescape((string *)&local_28);
          testing::internal::CmpHelperEQ<char[12],std::__cxx11::string>
                    ((internal *)&gtest_ar,"\"hello world\"","URI::queryUnescape(\"hello w%6frld\")"
                     ,(char (*) [12])"hello world",&local_28);
          std::__cxx11::string::~string((string *)&local_28);
          std::__cxx11::string::~string(local_48);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_28);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_48,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                       ,0x45,pcVar1);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_48,(Message *)&local_28);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_48);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_28);
          }
          goto LAB_001bad20;
        }
        testing::Message::Message((Message *)&local_28);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                   ,0x44,pcVar1);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_48,(Message *)&local_28);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_48);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_28);
LAB_001bad20:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(URI, queryUnescape)
{
    ASSERT_EQ("hello world", URI::queryUnescape("hello%20world"));
    ASSERT_EQ("hello%2world", URI::queryUnescape("hello%2world"));
    ASSERT_EQ("hello%world", URI::queryUnescape("hello%world"));
    ASSERT_EQ("hello world", URI::queryUnescape("hello w%6Frld"));
    ASSERT_EQ("hello world", URI::queryUnescape("hello w%6frld"));
}